

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_layout_peek(nk_rect *bounds,nk_context *ctx)

{
  undefined4 uVar1;
  undefined4 uVar2;
  long lVar3;
  long in_RSI;
  float *in_RDI;
  nk_panel *layout;
  nk_window *win;
  int index;
  float y;
  int in_stack_0000002c;
  nk_window *in_stack_00000030;
  nk_context *in_stack_00000038;
  nk_rect *in_stack_00000040;
  
  if (((in_RSI != 0) && (*(long *)(in_RSI + 0x40d8) != 0)) &&
     (*(long *)(*(long *)(in_RSI + 0x40d8) + 0xa8) != 0)) {
    lVar3 = *(long *)(*(long *)(in_RSI + 0x40d8) + 0xa8);
    uVar1 = *(undefined4 *)(lVar3 + 0x2c);
    uVar2 = *(undefined4 *)(lVar3 + 0x74);
    if (*(int *)(lVar3 + 0x80) <= *(int *)(lVar3 + 0x74)) {
      *(float *)(lVar3 + 0x2c) = *(float *)(lVar3 + 0x78) + *(float *)(lVar3 + 0x2c);
      *(undefined4 *)(lVar3 + 0x74) = 0;
    }
    nk_layout_widget_space(in_stack_00000040,in_stack_00000038,in_stack_00000030,in_stack_0000002c);
    if (*(int *)(lVar3 + 0x74) == 0) {
      *in_RDI = *in_RDI - *(float *)(lVar3 + 0x98);
    }
    *(undefined4 *)(lVar3 + 0x2c) = uVar1;
    *(undefined4 *)(lVar3 + 0x74) = uVar2;
  }
  return;
}

Assistant:

NK_LIB void
nk_layout_peek(struct nk_rect *bounds, struct nk_context *ctx)
{
float y;
int index;
struct nk_window *win;
struct nk_panel *layout;

NK_ASSERT(ctx);
NK_ASSERT(ctx->current);
NK_ASSERT(ctx->current->layout);
if (!ctx || !ctx->current || !ctx->current->layout)
return;

win = ctx->current;
layout = win->layout;
y = layout->at_y;
index = layout->row.index;
if (layout->row.index >= layout->row.columns) {
layout->at_y += layout->row.height;
layout->row.index = 0;
}
nk_layout_widget_space(bounds, ctx, win, nk_false);
if (!layout->row.index) {
bounds->x -= layout->row.item_offset;
}
layout->at_y = y;
layout->row.index = index;
}